

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O2

inform_pid_source * alloc_source(size_t *name,inform_error *err)

{
  inform_pid_source *src;
  size_t *psVar1;
  inform_pid_source **ppiVar2;
  
  src = (inform_pid_source *)malloc(0x40);
  if (src != (inform_pid_source *)0x0) {
    src->name = (size_t *)0x0;
    src->above = (inform_pid_source **)0x0;
    src->below = (inform_pid_source **)0x0;
    psVar1 = (size_t *)gvector_dup(name);
    if (psVar1 != (size_t *)0x0) {
      src->name = psVar1;
      psVar1 = (size_t *)gvector_shrink(psVar1);
      if (psVar1 != (size_t *)0x0) {
        src->name = psVar1;
        src->size = psVar1[-1];
        ppiVar2 = (inform_pid_source **)gvector_alloc(0,0,8);
        src->above = ppiVar2;
        if (ppiVar2 != (inform_pid_source **)0x0) {
          src->n_above = 0;
          ppiVar2 = (inform_pid_source **)gvector_alloc(0,0,8);
          src->below = ppiVar2;
          if (ppiVar2 != (inform_pid_source **)0x0) {
            src->n_below = 0;
            src->imin = 0.0;
            src->pi = 0.0;
            return src;
          }
        }
      }
    }
    free_source(src);
  }
  if (err != (inform_error *)0x0) {
    *err = INFORM_ENOMEM;
  }
  return (inform_pid_source *)0x0;
}

Assistant:

static inform_pid_source *alloc_source(size_t *name,
        inform_error *err)
{
    if (!name)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    inform_pid_source *src = malloc(sizeof(inform_pid_source));
    if (!src)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    src->name = NULL;
    src->above = src->below = NULL;

    size_t *local_name = gvector_dup(name);
    if (!local_name)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->name = local_name;

    local_name = gvector_shrink(src->name);
    if (!local_name)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->name = local_name;
    src->size = gvector_len(src->name);

    src->above = gvector_alloc(0, 0, sizeof(inform_pid_source*));
    if (!src->above)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->n_above = 0;

    src->below = gvector_alloc(0, 0, sizeof(inform_pid_source*));
    if (!src->below)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->n_below = 0;

    src->imin = src->pi = 0.0;

    return src;
}